

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cc
# Opt level: O0

bool __thiscall CpuProfiler::Start(CpuProfiler *this,char *fname,ProfilerOptions *options)

{
  bool bVar1;
  Options local_5c;
  undefined1 local_58 [4];
  Options collector_options;
  ProfileHandlerState prof_handler_state;
  SpinLockHolder local_30;
  SpinLockHolder cl;
  ProfilerOptions *options_local;
  char *fname_local;
  CpuProfiler *this_local;
  
  cl.lock_ = (SpinLock *)options;
  SpinLockHolder::SpinLockHolder(&local_30,&this->lock_);
  bVar1 = ProfileData::enabled(&this->collector_);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ProfileHandlerGetState((ProfileHandlerState *)local_58);
    ProfileData::Options::Options(&local_5c);
    ProfileData::Options::set_frequency(&local_5c,(int)local_58);
    bVar1 = ProfileData::Start(&this->collector_,fname,&local_5c);
    if (bVar1) {
      this->filter_ = (_func_int_void_ptr *)0x0;
      if ((cl.lock_ != (SpinLock *)0x0) && (*(long *)cl.lock_ != 0)) {
        this->filter_ = *(_func_int_void_ptr **)cl.lock_;
        this->filter_arg_ = *(void **)(cl.lock_ + 2);
      }
      EnableHandler(this);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  SpinLockHolder::~SpinLockHolder(&local_30);
  return this_local._7_1_;
}

Assistant:

bool CpuProfiler::Start(const char* fname, const ProfilerOptions* options) {
  SpinLockHolder cl(&lock_);

  if (collector_.enabled()) {
    return false;
  }

  ProfileHandlerState prof_handler_state;
  ProfileHandlerGetState(&prof_handler_state);

  ProfileData::Options collector_options;
  collector_options.set_frequency(prof_handler_state.frequency);
  if (!collector_.Start(fname, collector_options)) {
    return false;
  }

  filter_ = nullptr;
  if (options != nullptr && options->filter_in_thread != nullptr) {
    filter_ = options->filter_in_thread;
    filter_arg_ = options->filter_in_thread_arg;
  }

  // Setup handler for SIGPROF interrupts
  EnableHandler();

  return true;
}